

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ant.cpp
# Opt level: O2

void __thiscall
imrt::Ant::generateTour
          (Ant *this,
          vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
          *probability,vector<maths::Matrix,_std::allocator<maths::Matrix>_> *iprobability)

{
  int iVar1;
  int iVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  pair<int,_int> p;
  int i;
  long lVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  double dVar9;
  int local_7c;
  double local_78;
  Station *local_70;
  long local_68;
  long local_60;
  long local_58;
  vector<maths::Matrix,_std::allocator<maths::Matrix>_> *local_50;
  long local_48;
  ulong local_40;
  double local_38;
  
  lVar5 = 0;
  local_50 = iprobability;
  while (lVar5 < this->n_stations) {
    local_70 = Plan::get_station(this->p,(int)lVar5);
    lVar6 = lVar5 * 0x30;
    local_48 = lVar5 << 4;
    local_58 = lVar5 * 0x18;
    local_68 = lVar6;
    local_60 = lVar5;
    for (local_7c = 0; local_7c < this->n_apertures; local_7c = local_7c + 1) {
      iVar1 = rand();
      local_78 = (double)iVar1 / 2147483647.0;
      lVar5 = 0;
      bVar7 = false;
      while( true ) {
        iVar2 = Collimator::getIntensityLevelSize(this->collimator);
        iVar1 = local_7c;
        if ((iVar2 <= lVar5) || (bVar7)) break;
        bVar7 = local_78 <=
                *(double *)
                 (*(long *)(*(long *)((long)&((local_50->
                                              super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->p +
                                     local_48) + (long)local_7c * 8) + lVar5 * 8);
        if (bVar7) {
          *(int *)(*(long *)((long)&(((this->ref_intensity).
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data + local_58) + (long)local_7c * 4) =
               (int)lVar5;
          dVar9 = Collimator::getLevelIntensity(this->collimator,(int)lVar5);
          lVar6 = local_68;
          Station::setApertureIntensity(local_70,iVar1,dVar9);
        }
        lVar5 = lVar5 + 1;
      }
      dVar9 = 0.0;
      while( true ) {
        iVar1 = Collimator::getXdim(this->collimator);
        if ((long)iVar1 <= (long)dVar9) break;
        local_78 = dVar9;
        iVar1 = rand();
        local_38 = (double)iVar1 / 2147483647.0;
        lVar5 = 0;
        uVar8 = 0;
        while( true ) {
          iVar1 = Collimator::getReferenceSize(this->collimator);
          if ((iVar1 <= lVar5) || ((uVar8 & 1) != 0)) break;
          pmVar3 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                                 *)((long)&(((probability->
                                             super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                           _M_impl.field_0x0 + lVar6),&local_7c);
          bVar7 = local_38 <= pmVar3->p[(long)local_78][lVar5];
          uVar8 = CONCAT71((int7)(uVar8 >> 8),bVar7);
          if (bVar7) {
            pmVar4 = std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                   *)((long)&(((this->ref_plan).
                                               super__Vector_base<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                             _M_impl.field_0x0 + lVar6),&local_7c);
            dVar9 = local_78;
            iVar1 = local_7c;
            (pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start[(long)local_78] = (int)lVar5;
            local_40 = uVar8;
            p = Collimator::getReference(this->collimator,(int)lVar5);
            uVar8 = local_40;
            lVar6 = local_68;
            Station::setApertureShape(local_70,iVar1,SUB84(dVar9,0),p);
          }
          lVar5 = lVar5 + 1;
        }
        dVar9 = (double)((long)local_78 + 1);
      }
    }
    Station::generateIntensity(local_70);
    lVar5 = local_60 + 1;
  }
  Plan::eval(this->p);
  return;
}

Assistant:

void Ant::generateTour(vector<map <int, Matrix>> & probability, vector<Matrix>& iprobability) {
    double aux;
    bool flag;
    Station * st;
    for (int s = 0; s < n_stations; s++) {
      st = p->get_station(s);
      for (int ap=0; ap < n_apertures; ap++) {
        // Choose intensity
        aux = rand() / double(RAND_MAX);
        flag=false;
        for (int i=0; i< collimator.getIntensityLevelSize() && !flag; i++){
          if (iprobability[s](ap,i) >= aux ) {
            ref_intensity[s][ap]=i;
            st->setApertureIntensity(ap, collimator.getLevelIntensity(i));
            flag=true;
          }
        }
        
        // Choose aperture pattern 
        for (int j = 0; j < collimator.getXdim(); j++) {
          aux = rand() / double(RAND_MAX);
          flag = false;
          for (int r = 0; r < collimator.getReferenceSize() && !flag; r++) {
            if (probability[s][ap](j,r) >= aux) {
              ref_plan[s][ap][j] = r;
              st->setApertureShape(ap,j,collimator.getReference(r));
              flag = true;
            }
          }
        }
      }
      st->generateIntensity();
    }
    p->eval();
  }